

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

char * gl4cts::TextureViewUtilities::getTextureTargetString(GLenum texture_target)

{
  char *result;
  
  result = "[?]";
  if ((int)texture_target < 0x8c18) {
    if ((int)texture_target < 0x806f) {
      if (texture_target == 0xde0) {
        return "GL_TEXTURE_1D";
      }
      if (texture_target == 0xde1) {
        return "GL_TEXTURE_2D";
      }
    }
    else {
      if (texture_target == 0x806f) {
        return "GL_TEXTURE_3D";
      }
      if (texture_target == 0x84f5) {
        result = "GL_TEXTURE_RECTANGLE";
      }
      else if (texture_target == 0x8513) {
        return "GL_TEXTURE_CUBE_MAP";
      }
    }
  }
  else if ((int)texture_target < 0x9009) {
    if (texture_target == 0x8c18) {
      return "GL_TEXTURE_1D_ARRAY";
    }
    if (texture_target == 0x8c1a) {
      return "GL_TEXTURE_2D_ARRAY";
    }
    if (texture_target == 0x8c2a) {
      return "GL_TEXTURE_BUFFER";
    }
  }
  else {
    if (texture_target == 0x9009) {
      return "GL_TEXTURE_CUBE_MAP_ARRAY";
    }
    if (texture_target == 0x9100) {
      return "GL_TEXTURE_2D_MULTISAMPLE";
    }
    if (texture_target == 0x9102) {
      return "GL_TEXTURE_2D_MULTISAMPLE_ARRAY";
    }
  }
  return result;
}

Assistant:

const char* TextureViewUtilities::getTextureTargetString(const glw::GLenum texture_target)
{
	const char* result = "[?]";

	switch (texture_target)
	{
	case GL_TEXTURE_1D:
		result = "GL_TEXTURE_1D";
		break;
	case GL_TEXTURE_1D_ARRAY:
		result = "GL_TEXTURE_1D_ARRAY";
		break;
	case GL_TEXTURE_2D:
		result = "GL_TEXTURE_2D";
		break;
	case GL_TEXTURE_2D_ARRAY:
		result = "GL_TEXTURE_2D_ARRAY";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		result = "GL_TEXTURE_2D_MULTISAMPLE";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		result = "GL_TEXTURE_2D_MULTISAMPLE_ARRAY";
		break;
	case GL_TEXTURE_3D:
		result = "GL_TEXTURE_3D";
		break;
	case GL_TEXTURE_BUFFER:
		result = "GL_TEXTURE_BUFFER";
		break;
	case GL_TEXTURE_CUBE_MAP:
		result = "GL_TEXTURE_CUBE_MAP";
		break;
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		result = "GL_TEXTURE_CUBE_MAP_ARRAY";
		break;
	case GL_TEXTURE_RECTANGLE:
		result = "GL_TEXTURE_RECTANGLE";
		break;
	}

	return result;
}